

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O3

void __thiscall
singleParticleSpectra::output_two_particle_correlation_rap(singleParticleSpectra *this)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  ofstream output_ss;
  ofstream output_os;
  ofstream output;
  ostringstream filename_os;
  ostringstream filename_ss;
  ostringstream filename;
  double local_ad8;
  double local_ad0;
  char *local_ab8;
  char local_aa8 [16];
  char *local_a98;
  filebuf local_a90 [8];
  char local_a88 [8];
  uint auStack_a80 [56];
  ios_base aiStack_9a0 [264];
  char *local_898;
  filebuf local_890 [8];
  char local_888 [8];
  uint auStack_880 [56];
  ios_base aiStack_7a0 [264];
  char *local_698;
  filebuf local_690 [8];
  undefined8 uStack_688;
  uint auStack_680 [56];
  ios_base local_5a0 [264];
  ostringstream local_498 [112];
  ios_base local_428 [264];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->path_)._M_dataplus._M_p,
                      (this->path_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/particle_",10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_vn2_eta12",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_pT_",4);
  poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_",1);
  poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".dat",4);
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&local_698,local_a98,_S_out);
  if (local_a98 != local_a88) {
    operator_delete(local_a98);
  }
  bVar7 = this->rap_type == 0;
  pcVar3 = "# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>";
  if (bVar7) {
    pcVar3 = "# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_698,pcVar3,(ulong)bVar7 * 2 + 0x37);
  std::ios::widen((char)(ostream *)&local_698 + (char)*(undefined8 *)(local_698 + -0x18));
  std::ostream::put((char)&local_698);
  std::ostream::flush();
  if (0 < this->N_rap) {
    lVar4 = 0;
    do {
      dVar12 = this->drap;
      dVar10 = this->rapidity_dis_min;
      dVar9 = (double)this->total_number_of_events;
      dVar11 = *(double *)
                (*(long *)&(((this->QnSP_eta12).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar4 * 8) / dVar9;
      dVar8 = *(double *)
               (*(long *)&(((this->QnSP_eta12_err).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + lVar4 * 8) / dVar9 - dVar11 * dVar11;
      local_ad0 = 0.0;
      if (0.0 < dVar8) {
        dVar8 = dVar8 / dVar9;
        if (dVar8 < 0.0) {
          local_ad0 = sqrt(dVar8);
        }
        else {
          local_ad0 = SQRT(dVar8);
        }
      }
      *(uint *)((long)auStack_680 + *(long *)(local_698 + -0x18)) =
           *(uint *)((long)auStack_680 + *(long *)(local_698 + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)&uStack_688 + *(long *)(local_698 + -0x18)) = 0x12;
      *(undefined8 *)(local_690 + *(long *)(local_698 + -0x18)) = 8;
      poVar1 = std::ostream::_M_insert<double>((double)(int)lVar4 * dVar12 + dVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
      poVar1 = std::ostream::_M_insert<double>(dVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
      poVar1 = std::ostream::_M_insert<double>(local_ad0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
      poVar1 = std::ostream::_M_insert<double>(dVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
      poVar1 = std::ostream::_M_insert<double>
                         (*(this->Qn2_vector_err).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start / (double)this->total_number_of_events);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
      if (1 < this->order_max) {
        lVar2 = 1;
        lVar6 = 0x18;
        do {
          dVar10 = *(double *)
                    (*(long *)((long)&(((this->QnSP_eta12).
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data + lVar6) + lVar4 * 8) /
                   (double)this->total_number_of_events;
          local_ad8 = 0.0;
          dVar12 = 0.0;
          if (0.0 < dVar10) {
            dVar12 = dVar10 / dVar11;
            if (dVar12 < 0.0) {
              dVar12 = sqrt(dVar12);
            }
            else {
              dVar12 = SQRT(dVar12);
            }
            dVar8 = *(double *)
                     (*(long *)((long)&(((this->QnSP_eta12_err).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data + lVar6) + lVar4 * 8) /
                    (double)this->total_number_of_events - dVar10 * dVar10;
            local_ad8 = 0.0;
            if (0.0 < dVar8) {
              dVar8 = dVar8 / (double)this->total_number_of_events;
              if (dVar8 < 0.0) {
                dVar8 = sqrt(dVar8);
              }
              else {
                dVar8 = SQRT(dVar8);
              }
              local_ad8 = dVar8 / dVar11;
            }
          }
          *(uint *)((long)auStack_680 + *(long *)(local_698 + -0x18)) =
               *(uint *)((long)auStack_680 + *(long *)(local_698 + -0x18)) & 0xfffffefb | 0x100;
          *(undefined8 *)((long)&uStack_688 + *(long *)(local_698 + -0x18)) = 0x12;
          *(undefined8 *)(local_690 + *(long *)(local_698 + -0x18)) = 8;
          poVar1 = std::ostream::_M_insert<double>(dVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
          poVar1 = std::ostream::_M_insert<double>(local_ad8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
          poVar1 = std::ostream::_M_insert<double>(dVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
          poVar1 = std::ostream::_M_insert<double>
                             (*(double *)
                               (*(long *)((long)&(((this->QnSP_eta12_err).
                                                                                                      
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 )._M_impl.super__Vector_impl_data + lVar6) +
                               lVar4 * 8) / (double)this->total_number_of_events);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
          lVar2 = lVar2 + 1;
          lVar6 = lVar6 + 0x18;
        } while (lVar2 < this->order_max);
      }
      std::ios::widen((char)*(undefined8 *)(local_698 + -0x18) + (char)&local_698);
      std::ostream::put((char)&local_698);
      std::ostream::flush();
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->N_rap);
  }
  std::ofstream::close();
  local_698 = _VTT;
  uVar5 = _log;
  if (this->flag_charge_dependence == 1) {
    std::__cxx11::ostringstream::ostringstream(local_320);
    std::__cxx11::ostringstream::ostringstream(local_498);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_320,(this->path_)._M_dataplus._M_p,
                        (this->path_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/particle_",10);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_vn2_eta12_ss",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_pT_",4);
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_",1);
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".dat",4);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_498,(this->path_)._M_dataplus._M_p,
                        (this->path_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/particle_",10);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_vn2_eta12_os",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_pT_",4);
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_",1);
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".dat",4);
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&local_a98,local_898,_S_out);
    if (local_898 != local_888) {
      operator_delete(local_898);
    }
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&local_898,local_ab8,_S_out);
    if (local_ab8 != local_aa8) {
      operator_delete(local_ab8);
    }
    if (this->rap_type == 0) {
      pcVar3 = "# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>";
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_a98,"# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>",
                 0x39);
      std::ios::widen((char)(ostream *)&local_a98 + (char)*(undefined8 *)(local_a98 + -0x18));
      std::ostream::put((char)&local_a98);
      lVar4 = 0x39;
      std::ostream::flush();
    }
    else {
      pcVar3 = "# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>";
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_a98,"# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>",
                 0x37);
      std::ios::widen((char)(ostream *)&local_a98 + (char)*(undefined8 *)(local_a98 + -0x18));
      std::ostream::put((char)&local_a98);
      lVar4 = 0x37;
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_898,pcVar3,lVar4);
    std::ios::widen((char)(ostream *)&local_898 + (char)*(undefined8 *)(local_898 + -0x18));
    std::ostream::put((char)&local_898);
    std::ostream::flush();
    if (0 < this->N_rap) {
      lVar4 = 0;
      do {
        dVar9 = (double)(int)lVar4 * this->drap + this->rapidity_dis_min;
        dVar10 = (double)this->total_number_of_events;
        dVar8 = *(double *)
                 (*(long *)&(((this->Cn2_ss_eta12).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data + lVar4 * 8) / dVar10;
        dVar12 = *(double *)
                  (*(long *)&(((this->Cn2_ss_eta12_err).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar4 * 8) / dVar10 - dVar8 * dVar8;
        local_ad0 = 0.0;
        if (0.0 < dVar12) {
          dVar12 = dVar12 / dVar10;
          if (dVar12 < 0.0) {
            local_ad0 = sqrt(dVar12);
          }
          else {
            local_ad0 = SQRT(dVar12);
          }
        }
        *(uint *)((long)auStack_a80 + *(long *)(local_a98 + -0x18)) =
             *(uint *)((long)auStack_a80 + *(long *)(local_a98 + -0x18)) & 0xfffffefb | 0x100;
        pcVar3 = local_a88 + *(long *)(local_a98 + -0x18);
        pcVar3[0] = '\x12';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3[4] = '\0';
        pcVar3[5] = '\0';
        pcVar3[6] = '\0';
        pcVar3[7] = '\0';
        *(undefined8 *)(local_a90 + *(long *)(local_a98 + -0x18)) = 8;
        poVar1 = std::ostream::_M_insert<double>(dVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        poVar1 = std::ostream::_M_insert<double>(dVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        poVar1 = std::ostream::_M_insert<double>(local_ad0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        poVar1 = std::ostream::_M_insert<double>(dVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        std::ostream::_M_insert<double>
                  (*(double *)
                    (*(long *)&(((this->Cn2_ss_eta12_err).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data + lVar4 * 8) /
                   (double)this->total_number_of_events);
        dVar10 = (double)this->total_number_of_events;
        dVar11 = *(double *)
                  (*(long *)&(((this->Cn2_os_eta12).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar4 * 8) / dVar10;
        dVar12 = *(double *)
                  (*(long *)&(((this->Cn2_os_eta12_err).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar4 * 8) / dVar10 - dVar11 * dVar11;
        local_ad0 = 0.0;
        if (0.0 < dVar12) {
          dVar12 = dVar12 / dVar10;
          if (dVar12 < 0.0) {
            local_ad0 = sqrt(dVar12);
          }
          else {
            local_ad0 = SQRT(dVar12);
          }
        }
        *(uint *)((long)auStack_880 + *(long *)(local_898 + -0x18)) =
             *(uint *)((long)auStack_880 + *(long *)(local_898 + -0x18)) & 0xfffffefb | 0x100;
        pcVar3 = local_888 + *(long *)(local_898 + -0x18);
        pcVar3[0] = '\x12';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3[4] = '\0';
        pcVar3[5] = '\0';
        pcVar3[6] = '\0';
        pcVar3[7] = '\0';
        *(undefined8 *)(local_890 + *(long *)(local_898 + -0x18)) = 8;
        poVar1 = std::ostream::_M_insert<double>(dVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        poVar1 = std::ostream::_M_insert<double>(dVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        poVar1 = std::ostream::_M_insert<double>(local_ad0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        poVar1 = std::ostream::_M_insert<double>(dVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        std::ostream::_M_insert<double>
                  (*(double *)
                    (*(long *)&(((this->Cn2_os_eta12_err).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data + lVar4 * 8) /
                   (double)this->total_number_of_events);
        if (1 < this->order_max) {
          lVar6 = 1;
          lVar2 = 0x18;
          do {
            dVar10 = *(double *)
                      (*(long *)((long)&(((this->Cn2_ss_eta12).
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data + lVar2) + lVar4 * 8) /
                     (double)this->total_number_of_events;
            dVar12 = 0.0;
            local_ad8 = 0.0;
            if (0.0 < dVar10) {
              dVar12 = dVar10 / dVar8;
              if (dVar12 < 0.0) {
                dVar12 = sqrt(dVar12);
              }
              else {
                dVar12 = SQRT(dVar12);
              }
              dVar9 = *(double *)
                       (*(long *)((long)&(((this->Cn2_ss_eta12_err).
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data + lVar2) + lVar4 * 8) /
                      (double)this->total_number_of_events - dVar10 * dVar10;
              local_ad8 = 0.0;
              if (0.0 < dVar9) {
                dVar9 = dVar9 / (double)this->total_number_of_events;
                if (dVar9 < 0.0) {
                  dVar9 = sqrt(dVar9);
                }
                else {
                  dVar9 = SQRT(dVar9);
                }
                local_ad8 = dVar9 / dVar8;
              }
            }
            *(uint *)((long)auStack_a80 + *(long *)(local_a98 + -0x18)) =
                 *(uint *)((long)auStack_a80 + *(long *)(local_a98 + -0x18)) & 0xfffffefb | 0x100;
            pcVar3 = local_a88 + *(long *)(local_a98 + -0x18);
            pcVar3[0] = '\x12';
            pcVar3[1] = '\0';
            pcVar3[2] = '\0';
            pcVar3[3] = '\0';
            pcVar3[4] = '\0';
            pcVar3[5] = '\0';
            pcVar3[6] = '\0';
            pcVar3[7] = '\0';
            *(undefined8 *)(local_a90 + *(long *)(local_a98 + -0x18)) = 8;
            poVar1 = std::ostream::_M_insert<double>(dVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            poVar1 = std::ostream::_M_insert<double>(local_ad8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            poVar1 = std::ostream::_M_insert<double>(dVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            poVar1 = std::ostream::_M_insert<double>
                               (*(double *)
                                 (*(long *)((long)&(((this->Cn2_ss_eta12_err).
                                                                                                          
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + lVar2) +
                                 lVar4 * 8) / (double)this->total_number_of_events);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            dVar10 = *(double *)
                      (*(long *)((long)&(((this->Cn2_os_eta12).
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data + lVar2) + lVar4 * 8) /
                     (double)this->total_number_of_events;
            dVar12 = 0.0;
            local_ad8 = 0.0;
            if (0.0 < dVar10) {
              dVar12 = dVar10 / dVar11;
              if (dVar12 < 0.0) {
                dVar12 = sqrt(dVar12);
              }
              else {
                dVar12 = SQRT(dVar12);
              }
              dVar9 = *(double *)
                       (*(long *)((long)&(((this->Cn2_os_eta12_err).
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data + lVar2) + lVar4 * 8) /
                      (double)this->total_number_of_events - dVar10 * dVar10;
              local_ad8 = 0.0;
              if (0.0 < dVar9) {
                dVar9 = dVar9 / (double)this->total_number_of_events;
                if (dVar9 < 0.0) {
                  dVar9 = sqrt(dVar9);
                }
                else {
                  dVar9 = SQRT(dVar9);
                }
                local_ad8 = dVar9 / dVar11;
              }
            }
            *(uint *)((long)auStack_880 + *(long *)(local_898 + -0x18)) =
                 *(uint *)((long)auStack_880 + *(long *)(local_898 + -0x18)) & 0xfffffefb | 0x100;
            pcVar3 = local_888 + *(long *)(local_898 + -0x18);
            pcVar3[0] = '\x12';
            pcVar3[1] = '\0';
            pcVar3[2] = '\0';
            pcVar3[3] = '\0';
            pcVar3[4] = '\0';
            pcVar3[5] = '\0';
            pcVar3[6] = '\0';
            pcVar3[7] = '\0';
            *(undefined8 *)(local_890 + *(long *)(local_898 + -0x18)) = 8;
            poVar1 = std::ostream::_M_insert<double>(dVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            poVar1 = std::ostream::_M_insert<double>(local_ad8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            poVar1 = std::ostream::_M_insert<double>(dVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            poVar1 = std::ostream::_M_insert<double>
                               (*(double *)
                                 (*(long *)((long)&(((this->Cn2_os_eta12_err).
                                                                                                          
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + lVar2) +
                                 lVar4 * 8) / (double)this->total_number_of_events);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            lVar6 = lVar6 + 1;
            lVar2 = lVar2 + 0x18;
          } while (lVar6 < this->order_max);
        }
        std::ios::widen((char)*(undefined8 *)(local_a98 + -0x18) + (char)&local_a98);
        std::ostream::put((char)&local_a98);
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(local_898 + -0x18) + (char)&local_898);
        std::ostream::put((char)&local_898);
        std::ostream::flush();
        lVar4 = lVar4 + 1;
      } while (lVar4 < this->N_rap);
    }
    std::ofstream::close();
    std::ofstream::close();
    uVar5 = _log;
    pcVar3 = _VTT;
    local_898 = _VTT;
    *(undefined8 *)(local_890 + *(long *)(_VTT + -0x18) + -8) = _log;
    std::filebuf::~filebuf(local_890);
    std::ios_base::~ios_base(aiStack_7a0);
    local_a98 = pcVar3;
    *(undefined8 *)(local_a90 + *(long *)(pcVar3 + -0x18) + -8) = uVar5;
    std::filebuf::~filebuf(local_a90);
    std::ios_base::~ios_base(aiStack_9a0);
    std::__cxx11::ostringstream::~ostringstream(local_498);
    std::ios_base::~ios_base(local_428);
    std::__cxx11::ostringstream::~ostringstream(local_320);
    std::ios_base::~ios_base(local_2b0);
    local_698 = pcVar3;
  }
  *(undefined8 *)(local_690 + *(long *)(local_698 + -0x18) + -8) = uVar5;
  std::filebuf::~filebuf(local_690);
  std::ios_base::~ios_base(local_5a0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void singleParticleSpectra::output_two_particle_correlation_rap() {
    ostringstream filename;
    filename << path_ << "/particle_" << particle_monval << "_vn2_eta12"
             << "_pT_" << vn_rapidity_dis_pT_min << "_"
             << vn_rapidity_dis_pT_max << ".dat";
    ofstream output(filename.str().c_str());
    if (rap_type == 0) {
        output << "# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
               << endl;
    } else {
        output << "# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
               << endl;
    }

    for (int i = 0; i < N_rap; i++) {
        double eta_local = rapidity_dis_min + i * drap;
        double num_pair = QnSP_eta12[0][i] / total_number_of_events;
        double num_pair_stdsq =
            (QnSP_eta12_err[0][i] / total_number_of_events
             - num_pair * num_pair);
        double num_pair_err = 0.0;
        if (num_pair_stdsq > 0) {
            num_pair_err = sqrt(num_pair_stdsq / total_number_of_events);
        }
        output << scientific << setw(18) << setprecision(8) << eta_local << "  "
               << num_pair << "  " << num_pair_err << "  " << num_pair << "  "
               << Qn2_vector_err[0] / total_number_of_events << "  ";
        for (int iorder = 1; iorder < order_max; iorder++) {
            double vn2_avg = 0.0;
            double vn2_err = 0.0;
            double Qn2_avg = QnSP_eta12[iorder][i] / total_number_of_events;
            if (Qn2_avg > 0.) {
                vn2_avg = sqrt(Qn2_avg / num_pair);
                double Qn2_stdsq =
                    (QnSP_eta12_err[iorder][i] / total_number_of_events
                     - Qn2_avg * Qn2_avg);
                if (Qn2_stdsq > 0) {
                    double Qn2_err = sqrt(Qn2_stdsq / total_number_of_events);
                    vn2_err = Qn2_err / num_pair;
                }
            }
            output << scientific << setw(18) << setprecision(8) << vn2_avg
                   << "  " << vn2_err << "  " << Qn2_avg << "  "
                   << QnSP_eta12_err[iorder][i] / total_number_of_events
                   << "  ";
        }
        output << endl;
    }
    output.close();

    if (flag_charge_dependence == 1) {
        ostringstream filename_ss, filename_os;
        filename_ss << path_ << "/particle_" << particle_monval
                    << "_vn2_eta12_ss"
                    << "_pT_" << vn_rapidity_dis_pT_min << "_"
                    << vn_rapidity_dis_pT_max << ".dat";
        filename_os << path_ << "/particle_" << particle_monval
                    << "_vn2_eta12_os"
                    << "_pT_" << vn_rapidity_dis_pT_min << "_"
                    << vn_rapidity_dis_pT_max << ".dat";
        ofstream output_ss(filename_ss.str().c_str());
        ofstream output_os(filename_os.str().c_str());
        if (rap_type == 0) {
            output_ss
                << "# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                << endl;
            output_os
                << "# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                << endl;
        } else {
            output_ss
                << "# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                << endl;
            output_os
                << "# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                << endl;
        }
        for (int j = 0; j < N_rap; j++) {
            double eta_local = rapidity_dis_min + j * drap;

            double num_pair_ss = Cn2_ss_eta12[0][j] / total_number_of_events;
            double num_pair_ss_stdsq =
                (Cn2_ss_eta12_err[0][j] / total_number_of_events
                 - num_pair_ss * num_pair_ss);
            double num_pair_ss_err = 0.0;
            if (num_pair_ss_stdsq > 0) {
                num_pair_ss_err =
                    (sqrt(num_pair_ss_stdsq / total_number_of_events));
            }
            output_ss << scientific << setw(18) << setprecision(8) << eta_local
                      << "  " << num_pair_ss << "  " << num_pair_ss_err << "  "
                      << num_pair_ss << "  "
                      << Cn2_ss_eta12_err[0][j] / total_number_of_events;

            double num_pair_os = Cn2_os_eta12[0][j] / total_number_of_events;
            double num_pair_os_stdsq =
                (Cn2_os_eta12_err[0][j] / total_number_of_events
                 - num_pair_os * num_pair_os);
            double num_pair_os_err = 0.0;
            if (num_pair_os_stdsq > 0) {
                num_pair_os_err =
                    (sqrt(num_pair_os_stdsq / total_number_of_events));
            }
            output_os << scientific << setw(18) << setprecision(8) << eta_local
                      << "  " << num_pair_os << "  " << num_pair_os_err << "  "
                      << num_pair_os << "  "
                      << Cn2_os_eta12_err[0][j] / total_number_of_events;

            for (int i = 1; i < order_max; i++) {
                double vn2_avg = 0.0;
                double vn2_err = 0.0;
                double Cn2_ss_avg =
                    (Cn2_ss_eta12[i][j] / total_number_of_events);
                if (Cn2_ss_avg > 0.) {
                    vn2_avg = sqrt(Cn2_ss_avg / num_pair_ss);
                    double Cn2_ss_stdsq =
                        (Cn2_ss_eta12_err[i][j] / total_number_of_events
                         - Cn2_ss_avg * Cn2_ss_avg);
                    double Cn2_ss_err = 0.0;
                    if (Cn2_ss_stdsq > 0) {
                        Cn2_ss_err =
                            sqrt(Cn2_ss_stdsq / total_number_of_events);
                        vn2_err = Cn2_ss_err / num_pair_ss;
                    }
                }
                output_ss << scientific << setw(18) << setprecision(8)
                          << vn2_avg << "  " << vn2_err << "  " << Cn2_ss_avg
                          << "  "
                          << Cn2_ss_eta12_err[i][j] / total_number_of_events
                          << "  ";

                vn2_avg = 0.0;
                vn2_err = 0.0;
                double Cn2_os_avg =
                    (Cn2_os_eta12[i][j] / total_number_of_events);
                if (Cn2_os_avg > 0.) {
                    vn2_avg = sqrt(Cn2_os_avg / num_pair_os);
                    double Cn2_os_stdsq =
                        (Cn2_os_eta12_err[i][j] / total_number_of_events
                         - Cn2_os_avg * Cn2_os_avg);
                    double Cn2_os_err = 0.0;
                    if (Cn2_os_stdsq > 0) {
                        Cn2_os_err =
                            sqrt(Cn2_os_stdsq / total_number_of_events);
                        vn2_err = Cn2_os_err / num_pair_os;
                    }
                }
                output_os << scientific << setw(18) << setprecision(8)
                          << vn2_avg << "  " << vn2_err << "  " << Cn2_os_avg
                          << "  "
                          << Cn2_os_eta12_err[i][j] / total_number_of_events
                          << "  ";
            }
            output_ss << endl;
            output_os << endl;
        }
        output_ss.close();
        output_os.close();
    }
}